

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O1

string * duckdb::StringUtil::Format<duckdb::SQLString>
                   (string *__return_storage_ptr__,string *fmt_str,SQLString *params)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (params->raw_string)._M_dataplus._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (params->raw_string)._M_string_length);
  Exception::ConstructMessage<duckdb::SQLString>
            (__return_storage_ptr__,fmt_str,(SQLString *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}